

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_byte(lua_State *L)

{
  char *pcVar1;
  lua_Integer def;
  ulong uVar2;
  uint space;
  ulong uVar3;
  ulong uVar4;
  size_t l;
  
  pcVar1 = luaL_checklstring(L,1,&l);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (l < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + l + 1;
    }
  }
  uVar2 = luaL_optinteger(L,3,def);
  if ((long)uVar2 < 0) {
    if (l < -uVar2) {
      uVar2 = 0;
    }
    else {
      uVar2 = uVar2 + l + 1;
    }
  }
  uVar3 = def + (ulong)(def == 0);
  if (uVar2 < l) {
    l = uVar2;
  }
  space = 0;
  if (uVar3 <= l) {
    space = ((int)l - (int)uVar3) + 1;
    if (l < (long)(int)space + uVar3) {
      luaL_checkstack(L,space,"string slice too long");
      uVar4 = 0;
      uVar2 = 0;
      if (0 < (int)space) {
        uVar2 = (ulong)space;
      }
      for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        lua_pushinteger(L,(ulong)(byte)pcVar1[uVar4 + (uVar3 - 1)]);
      }
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t posi = posrelat(luaL_optinteger(L, 2, 1), l);
  size_t pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi < 1) posi = 1;
  if (pose > l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  n = (int)(pose -  posi + 1);
  if (posi + n <= pose)  /* (size_t -> int) overflow? */
    return luaL_error(L, "string slice too long");
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}